

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::RandomUniformCase::test
          (RandomUniformCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,
          vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsRef,ShaderProgram *program,Random *rnd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *log;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_00;
  bool bVar3;
  deBool dVar4;
  deBool dVar5;
  deBool dVar6;
  UniformCase *pUVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  reportsUniform;
  ScopedLogSection section;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  reportsUniformsiv;
  string local_100;
  string local_e0;
  deUint32 local_bc;
  vector<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  local_b8;
  UniformCase *local_98;
  ScopedLogSection local_90;
  undefined4 local_84;
  undefined4 local_80;
  deBool local_7c;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  local_78;
  undefined4 local_54;
  deBool local_50;
  undefined4 local_4c;
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportRef>_>
  *local_48;
  ShaderProgram *local_40;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *local_38;
  
  local_48 = basicUniformReportsRef;
  local_40 = program;
  local_38 = basicUniforms;
  if (((this->super_UniformCase).super_CallLogWrapper.field_0x15 & 1) == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = anon_unknown_1::UniformCollection::containsSeveralSamplerTypes
                      ((this->super_UniformCase).m_uniformCollection.m_ptr);
  }
  dVar4 = deRandom_getBool(&rnd->m_rnd);
  dVar5 = deRandom_getBool(&rnd->m_rnd);
  if (dVar5 == 1 && dVar4 == 1) {
    dVar6 = deRandom_getBool(&rnd->m_rnd);
    local_80 = CONCAT31((int3)((uint)dVar6 >> 8),dVar6 == 1);
  }
  else {
    local_80 = 0;
  }
  local_7c = deRandom_getBool(&rnd->m_rnd);
  local_98 = &this->super_UniformCase;
  if (local_7c == 1) {
    dVar6 = deRandom_getBool(&rnd->m_rnd);
    local_84 = CONCAT31((int3)((uint)dVar6 >> 8),dVar6 == 1);
  }
  else {
    local_84 = 0;
  }
  bVar9 = local_7c != 1;
  local_50 = deRandom_getBool(&rnd->m_rnd);
  bVar10 = local_50 != 1;
  if (bVar9 || bVar10) {
    local_54 = 0;
  }
  else {
    dVar6 = deRandom_getBool(&rnd->m_rnd);
    local_54 = (undefined4)CONCAT71((int7)((ulong)rnd >> 8),dVar6 == 1);
  }
  if (bVar3 == false && !bVar10) {
    dVar6 = deRandom_getBool(&rnd->m_rnd);
    local_4c = (undefined4)CONCAT71((int7)((ulong)program >> 8),dVar6 == 1);
  }
  else {
    local_4c = 0;
  }
  pUVar7 = local_98;
  bVar9 = dVar4 == 1;
  bVar3 = (bool)((byte)local_4c ^ 1 | bVar9);
  if ((char)local_54 != '\0') {
    bVar3 = bVar9;
  }
  if (local_50 == 1) {
    bVar3 = bVar9;
  }
  if ((char)local_84 != '\0') {
    bVar3 = bVar9;
  }
  if (local_7c == 1) {
    bVar3 = bVar9;
  }
  if ((char)local_80 != '\0') {
    bVar3 = bVar9;
  }
  local_bc = (local_40->m_program).m_program;
  log = ((local_98->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  if (dVar5 == 1) {
    bVar3 = bVar9;
  }
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar9 || bVar3 != false) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"InfoGetActiveUniform","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Uniform information queries with glGetActiveUniform()","");
    tcu::ScopedLogSection::ScopedLogSection(&local_90,log,&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = UniformCase::getActiveUniforms
                      (pUVar7,(vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                               *)&local_b8,local_48,local_bc);
    tcu::TestLog::endSection(local_90.m_log);
    if (!bVar3) goto LAB_011ffd5d;
  }
  if (dVar5 == 1) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"InfoGetActiveUniformsiv","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,
               "Uniform information queries with glGetIndices() and glGetActiveUniformsiv()","");
    tcu::ScopedLogSection::ScopedLogSection(&local_90,log,&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = UniformCase::getActiveUniformsiv(pUVar7,&local_78,local_48,local_bc);
    tcu::TestLog::endSection(local_90.m_log);
    pUVar7 = local_98;
    if (!bVar3) goto LAB_011ffd5d;
  }
  if ((char)local_80 != '\0') {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"CompareUniformVsUniformsiv","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,
               "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()","");
    tcu::ScopedLogSection::ScopedLogSection(&local_90,log,&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = UniformCase::uniformVsUniformsivComparison
                      (pUVar7,(vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                               *)&local_b8,&local_78);
    tcu::TestLog::endSection(local_90.m_log);
    pUVar7 = local_98;
    if (!bVar3) {
LAB_011ffd5d:
      std::
      vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
      ::~vector(&local_78);
      std::
      vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
      ::~vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                 *)&local_b8);
      return false;
    }
  }
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector(&local_78);
  std::
  vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
  ::~vector((vector<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
             *)&local_b8);
  basicUniforms_00 = local_38;
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_7c == 1) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"GetUniformDefaults","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Uniform default value query","");
    tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = UniformCase::getUniforms(pUVar7,&local_b8,basicUniforms_00,local_bc);
    tcu::TestLog::endSection
              ((TestLog *)
               local_78.
               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
               ._M_impl.super__Vector_impl_data._M_start);
    pUVar7 = local_98;
    if (!bVar3) goto LAB_011ffd76;
  }
  if ((char)local_84 != '\0') {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"DefaultValueCheck","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Verify that the uniforms have correct initial values (zeros)",
               "");
    tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = UniformCase::checkUniformDefaultValues
                      ((UniformCase *)
                       ((pUVar7->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                       &local_b8,basicUniforms_00);
    tcu::TestLog::endSection
              ((TestLog *)
               local_78.
               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
               ._M_impl.super__Vector_impl_data._M_start);
    pUVar7 = local_98;
    if (!bVar3) goto LAB_011ffd76;
  }
  if (local_b8.
      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar8 = (char)local_54;
  if (local_50 == 1) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"UniformAssign","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Uniform value assignments","");
    tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    UniformCase::assignUniforms(pUVar7,basicUniforms_00,local_bc,rnd);
    cVar8 = (char)local_54;
    tcu::TestLog::endSection
              ((TestLog *)
               local_78.
               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (cVar8 != '\0') {
    paVar1 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"GetUniforms","");
    paVar2 = &local_100.field_2;
    local_100._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Uniform value query","");
    tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_78,log,&local_e0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = UniformCase::getUniforms(pUVar7,&local_b8,basicUniforms_00,local_bc);
    tcu::TestLog::endSection
              ((TestLog *)
               local_78.
               super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (bVar3) {
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ValueCheck","");
      local_100._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"Verify that the reported values match the assigned values",""
                );
      pUVar7 = local_98;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_78,log,&local_e0,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != paVar2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      bVar3 = UniformCase::compareUniformValues
                        ((UniformCase *)
                         ((pUVar7->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         &local_b8,basicUniforms_00);
      tcu::TestLog::endSection
                ((TestLog *)
                 local_78.
                 super__Vector_base<deqp::gles3::Functional::UniformCase::BasicUniformReportGL,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniformReportGL>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pUVar7 = local_98;
      if (bVar3) {
        if (local_b8.
            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_011ffc9e;
      }
    }
LAB_011ffd76:
    if (local_b8.
        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return false;
  }
LAB_011ffc9e:
  if ((char)local_4c == '\0') {
    return true;
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"RenderTest","");
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Render test","");
  tcu::ScopedLogSection::ScopedLogSection((ScopedLogSection *)&local_b8,log,&local_e0,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  bVar3 = UniformCase::renderTest(pUVar7,basicUniforms_00,local_40,rnd);
  tcu::TestLog::endSection
            ((TestLog *)
             local_b8.
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::VarValue>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (!bVar3) {
    return false;
  }
  return true;
}

Assistant:

bool RandomUniformCase::test (const vector<BasicUniform>& basicUniforms, const vector<BasicUniformReportRef>& basicUniformReportsRef, const ShaderProgram& program, Random& rnd)
{
	// \note Different sampler types may not be bound to same unit when rendering.
	const bool		renderingPossible						= (m_features & FEATURE_UNIFORMVALUE_ZERO) == 0 || !m_uniformCollection->containsSeveralSamplerTypes();

	bool			performGetActiveUniforms				= rnd.getBool();
	const bool		performGetActiveUniformsiv				= rnd.getBool();
	const bool		performUniformVsUniformsivComparison	= performGetActiveUniforms && performGetActiveUniformsiv && rnd.getBool();
	const bool		performGetUniforms						= rnd.getBool();
	const bool		performCheckUniformDefaultValues		= performGetUniforms && rnd.getBool();
	const bool		performAssignUniforms					= rnd.getBool();
	const bool		performCompareUniformValues				= performGetUniforms && performAssignUniforms && rnd.getBool();
	const bool		performRenderTest						= renderingPossible && performAssignUniforms && rnd.getBool();
	const deUint32	programGL								= program.getProgram();
	TestLog&		log										= m_testCtx.getLog();

	if (!(performGetActiveUniforms || performGetActiveUniformsiv || performUniformVsUniformsivComparison || performGetUniforms || performCheckUniformDefaultValues || performAssignUniforms || performCompareUniformValues || performRenderTest))
		performGetActiveUniforms = true; // Do something at least.

#define PERFORM_AND_CHECK(CALL, SECTION_NAME, SECTION_DESCRIPTION)						\
	do																					\
	{																					\
		const ScopedLogSection section(log, (SECTION_NAME), (SECTION_DESCRIPTION));		\
		const bool success = (CALL);													\
		if (!success)																	\
			return false;																\
	} while (false)

	{
		vector<BasicUniformReportGL> reportsUniform;
		vector<BasicUniformReportGL> reportsUniformsiv;

		if (performGetActiveUniforms)
			PERFORM_AND_CHECK(getActiveUniforms(reportsUniform, basicUniformReportsRef, programGL), "InfoGetActiveUniform", "Uniform information queries with glGetActiveUniform()");
		if (performGetActiveUniformsiv)
			PERFORM_AND_CHECK(getActiveUniformsiv(reportsUniformsiv, basicUniformReportsRef, programGL), "InfoGetActiveUniformsiv", "Uniform information queries with glGetIndices() and glGetActiveUniformsiv()");
		if (performUniformVsUniformsivComparison)
			PERFORM_AND_CHECK(uniformVsUniformsivComparison(reportsUniform, reportsUniformsiv), "CompareUniformVsUniformsiv", "Comparison of results from glGetActiveUniform() and glGetActiveUniformsiv()");
	}

	{
		vector<VarValue> uniformDefaultValues;

		if (performGetUniforms)
			PERFORM_AND_CHECK(getUniforms(uniformDefaultValues, basicUniforms, programGL), "GetUniformDefaults", "Uniform default value query");
		if (performCheckUniformDefaultValues)
			PERFORM_AND_CHECK(checkUniformDefaultValues(uniformDefaultValues, basicUniforms), "DefaultValueCheck", "Verify that the uniforms have correct initial values (zeros)");
	}

	{
		vector<VarValue> uniformValues;

		if (performAssignUniforms)
		{
			const ScopedLogSection section(log, "UniformAssign", "Uniform value assignments");
			assignUniforms(basicUniforms, programGL, rnd);
		}
		if (performCompareUniformValues)
		{
			PERFORM_AND_CHECK(getUniforms(uniformValues, basicUniforms, programGL), "GetUniforms", "Uniform value query");
			PERFORM_AND_CHECK(compareUniformValues(uniformValues, basicUniforms), "ValueCheck", "Verify that the reported values match the assigned values");
		}
	}

	if (performRenderTest)
		PERFORM_AND_CHECK(renderTest(basicUniforms, program, rnd), "RenderTest", "Render test");

#undef PERFORM_AND_CHECK

	return true;
}